

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

int mwRelink(mwData *mw,char *file,int line)

{
  mwData *pmVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  mwStat *pmVar5;
  long lVar6;
  mwData *pmVar7;
  mwData *pmVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  
  pcVar11 = "unknown";
  if (file != (char *)0x0) {
    pcVar11 = file;
  }
  if (mw == (mwData *)0x0) {
    mwWrite("relink: cannot repair MW at NULL\n");
LAB_00108f27:
    mwFlush();
    if (mwTail == (mwData *)0x0 && mwHead == (mwData *)0x0) {
      pcVar10 = "relink: <%ld> %s(%d) heap damaged beyond repair\n";
      if (mwStatCurAlloc == 0) {
        pcVar10 = "relink: <%ld> %s(%d) heap is empty, nothing to repair\n";
      }
      mwWrite(pcVar10,mwCounter,pcVar11,(ulong)(uint)line);
      mwFlush();
      return 0;
    }
    mwWrite("relink: <%ld> %s(%d) attempting emergency repairs...\n",mwCounter,pcVar11,
            (ulong)(uint)line);
    mwFlush();
    if (mwTail == (mwData *)0x0 || mwHead == (mwData *)0x0) {
      if (mwHead == (mwData *)0x0) {
        pcVar11 = "relink: mwHead is NULL, but mwTail is %p\n";
        pmVar8 = mwTail;
      }
      else {
        pcVar11 = "relink: mwTail is NULL, but mwHead is %p\n";
        pmVar8 = mwHead;
      }
      mwWrite(pcVar11,pmVar8);
    }
    pmVar8 = (mwData *)0x0;
    uVar9 = 0;
    if (mwHead != (mwData *)0x0) {
      if (mwDataSize != '\0') {
        uVar9 = 0x38;
      }
      iVar4 = mwIsReadAddr(mwHead,uVar9);
      if ((iVar4 == 0) ||
         ((mwHead->count ^ mwHead->check ^ mwHead->size ^ (long)mwHead->line) != 0xfe0180)) {
        pmVar8 = (mwData *)0x0;
        mwWrite("relink: mwHead (MW-%p) is damaged, skipping forward scan\n",mwHead);
        mwHead = (mwData *)0x0;
      }
      else {
        pmVar8 = mwHead;
        if (mwHead->prev != (mwData *)0x0) {
          mwWrite("relink: the mwHead pointer\'s \'prev\' member is %p, not NULL\n");
          pmVar8 = mwHead;
        }
        for (; pmVar8 != (mwData *)0x0; pmVar8 = pmVar8->next) {
          if (pmVar8->next != (mwData *)0x0) {
            uVar9 = 0;
            if (mwDataSize != '\0') {
              uVar9 = 0x38;
            }
            iVar4 = mwIsReadAddr(pmVar8->next,uVar9);
            if (((iVar4 == 0) ||
                (((long)pmVar8->line ^ pmVar8->size ^ pmVar8->count ^
                 (ulong)(pmVar8->next->check == 0)) != 0xfe0180)) || (pmVar8->next->prev != pmVar8))
            {
              pcVar10 = "NoMansLand ";
              pcVar11 = "NoMansLand ";
              if ((mw->flag & 1) == 0) {
                pcVar11 = "";
              }
              mwWrite("relink: forward chain\'s last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
                      pmVar8,pmVar8->size,pcVar11,pmVar8->file,(ulong)(uint)pmVar8->line);
              uVar9 = 0x38;
              if (mwDataSize == '\0') {
                uVar9 = 0;
              }
              iVar4 = mwIsReadAddr(pmVar8->next,uVar9);
              pmVar7 = pmVar8->next;
              if (iVar4 == 0) {
                mwWrite("relink: the \'next\' pointer of this MW points to %p, which is out-of-legal-access\n"
                        ,pmVar7);
              }
              else {
                sVar2 = pmVar8->size;
                if ((mw->flag & 1) == 0) {
                  pcVar10 = "";
                }
                iVar4 = mwIsReadAddr(pmVar8->file,0x10);
                if (iVar4 == 0) {
                  pcVar11 = "<garbage-pointer>";
                }
                else {
                  pcVar11 = pmVar8->file;
                }
                mwWrite("relink: forward chain\'s first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n"
                        ,pmVar7,sVar2,pcVar10,pcVar11,(ulong)(uint)pmVar8->line);
              }
              goto LAB_001090e2;
            }
          }
        }
        pmVar8 = (mwData *)0x0;
      }
    }
LAB_001090e2:
    pmVar7 = (mwData *)0x0;
    uVar9 = 0;
    if (mwTail != (mwData *)0x0) {
      if (mwDataSize != '\0') {
        uVar9 = 0x38;
      }
      iVar4 = mwIsReadAddr(mwTail,uVar9);
      if ((iVar4 == 0) ||
         ((mwTail->count ^ mwTail->check ^ mwTail->size ^ (long)mwTail->line) != 0xfe0180)) {
        pmVar7 = (mwData *)0x0;
        mwWrite("relink: mwTail (%p) is damaged, skipping reverse scan\n",mwTail);
        mwTail = (mwData *)0x0;
      }
      else {
        pmVar7 = mwTail;
        if (mwTail->next != (mwData *)0x0) {
          mwWrite("relink: the mwTail pointer\'s \'next\' member is %p, not NULL\n");
          pmVar7 = mwTail;
        }
        for (; pmVar7 != (mwData *)0x0; pmVar7 = pmVar7->prev) {
          if (pmVar7->prev != (mwData *)0x0) {
            uVar9 = 0;
            if (mwDataSize != '\0') {
              uVar9 = 0x38;
            }
            iVar4 = mwIsReadAddr(pmVar7->prev,uVar9);
            if (((iVar4 == 0) ||
                (((long)pmVar7->line ^ pmVar7->size ^ pmVar7->count ^
                 (ulong)(pmVar7->prev->check == 0)) != 0xfe0180)) || (pmVar7->prev->next != pmVar7))
            {
              pcVar10 = "NoMansLand ";
              pcVar11 = "NoMansLand ";
              if ((mw->flag & 1) == 0) {
                pcVar11 = "";
              }
              mwWrite("relink: reverse chain\'s last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
                      pmVar7,pmVar7->size,pcVar11,pmVar7->file,(ulong)(uint)pmVar7->line);
              uVar9 = 0x38;
              if (mwDataSize == '\0') {
                uVar9 = 0;
              }
              iVar4 = mwIsReadAddr(pmVar7->prev,uVar9);
              pmVar1 = pmVar7->prev;
              if (iVar4 == 0) {
                mwWrite("relink: the \'prev\' pointer of this MW points to %p, which is out-of-legal-access\n"
                        ,pmVar1);
              }
              else {
                sVar2 = pmVar7->size;
                if ((mw->flag & 1) == 0) {
                  pcVar10 = "";
                }
                iVar4 = mwIsReadAddr(pmVar7->file,0x10);
                if (iVar4 == 0) {
                  pcVar11 = "<garbage-pointer>";
                }
                else {
                  pcVar11 = pmVar7->file;
                }
                mwWrite("relink: reverse chain\'s first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n"
                        ,pmVar1,sVar2,pcVar10,pcVar11,(ulong)(uint)pmVar7->line);
              }
              goto LAB_001091ee;
            }
          }
        }
        pmVar7 = (mwData *)0x0;
      }
    }
LAB_001091ee:
    if (mwTail == (mwData *)0x0 && mwHead == (mwData *)0x0) {
      pcVar11 = "relink: both head and tail pointers damaged, aborting program\n";
      goto LAB_001095b0;
    }
    if (mwHead == (mwData *)0x0) {
      pmVar8 = (mwData *)0x0;
      mwHead = pmVar7;
      mwWrite("relink: heap truncated, MW-%p designated as new mwHead\n",pmVar7);
      pmVar7->prev = (mwData *)0x0;
      pmVar7 = (mwData *)0x0;
    }
    if (mwTail == (mwData *)0x0) {
      pmVar7 = (mwData *)0x0;
      mwTail = pmVar8;
      mwWrite("relink: heap truncated, MW-%p designated as new mwTail\n",pmVar8);
      pmVar8->next = (mwData *)0x0;
      pmVar8 = (mwData *)0x0;
    }
    if (((pmVar8 == (mwData *)0x0 && pmVar7 == (mwData *)0x0) && (mwHead->prev == (mwData *)0x0)) &&
       (mwTail->next == (mwData *)0x0)) {
      pcVar11 = "relink: verifying heap integrity...\n";
    }
    else {
      if (((pmVar8 == pmVar7) || (pmVar8 == (mwData *)0x0)) || (pmVar7 == (mwData *)0x0)) {
        pcVar11 = "relink: heap totally destroyed, aborting program\n";
        goto LAB_001095b0;
      }
      pmVar8->next = pmVar7;
      pmVar7->prev = pmVar8;
      pcVar11 = "relink: emergency repairs successful, assessing damage...\n";
    }
    mwWrite(pcVar11);
LAB_001092b6:
    mwFlush();
  }
  else {
    uVar9 = 0x38;
    if (mwDataSize == '\0') {
      uVar9 = 0;
    }
    iVar4 = mwIsSafeAddr(mw,uVar9);
    if (iVar4 == 0) {
      pcVar10 = "relink: MW-%p is a garbage pointer\n";
LAB_00108f1d:
      mwWrite(pcVar10,mw);
      goto LAB_00108f27;
    }
    uVar9 = 0;
    mwWrite("relink: <%ld> %s(%d) attempting to repair MW-%p...\n",mwCounter,pcVar11,
            (ulong)(uint)line,mw);
    mwFlush();
    if (mwHead == mw) {
      bVar3 = false;
      mwWrite("relink: MW-%p is the head (first) allocation\n",mw);
      if (mw->prev != (mwData *)0x0) {
        bVar3 = false;
        mwWrite("relink: MW-%p prev pointer is non-NULL, you have a wild pointer\n",mw);
        mw->prev = (mwData *)0x0;
      }
    }
    else {
      if (mwDataSize != '\0') {
        uVar9 = 0x38;
      }
      iVar4 = mwIsSafeAddr(mwHead,uVar9);
      pmVar8 = mwHead;
      if (iVar4 == 0) {
        pcVar10 = "relink: failed for MW-%p; head pointer destroyed\n";
        goto LAB_00108f1d;
      }
      for (; pmVar8 != (mwData *)0x0; pmVar8 = pmVar8->next) {
        pmVar7 = pmVar8->next;
        if (pmVar7 == mw) {
          mw->prev = pmVar8;
          bVar3 = false;
          goto LAB_00108e24;
        }
        if (pmVar7 != (mwData *)0x0) {
          uVar9 = 0;
          if (mwDataSize != '\0') {
            uVar9 = 0x38;
          }
          iVar4 = mwIsSafeAddr(pmVar7,uVar9);
          if ((iVar4 == 0) || (pmVar8->next->prev != pmVar8)) {
            pmVar7 = pmVar8->next;
            pcVar10 = 
            "relink: failed for MW-%p; forward chain fragmented at MW-%p: \'next\' is %p\n";
            goto LAB_001093eb;
          }
        }
      }
      mwWrite("relink: MW-%p not found in forward chain search\n",mw);
      mwFlush();
      bVar3 = true;
    }
LAB_00108e24:
    if (mwTail != mw) {
      uVar9 = 0x38;
      if (mwDataSize == '\0') {
        uVar9 = 0;
      }
      iVar4 = mwIsSafeAddr(mwTail,uVar9);
      pmVar8 = mwTail;
      if (iVar4 == 0) {
        pcVar10 = "relink: failed for MW-%p; tail pointer destroyed\n";
        goto LAB_00108f1d;
      }
      for (; pmVar8 != (mwData *)0x0; pmVar8 = pmVar8->prev) {
        pmVar7 = pmVar8->prev;
        if (pmVar7 == mw) {
          mw->next = pmVar8;
          goto LAB_00109401;
        }
        if (pmVar7 != (mwData *)0x0) {
          uVar9 = 0;
          if (mwDataSize != '\0') {
            uVar9 = 0x38;
          }
          iVar4 = mwIsSafeAddr(pmVar7,uVar9);
          if ((iVar4 != 0) && (pmVar8->prev->next == pmVar8)) goto LAB_00108e9f;
          pmVar7 = pmVar8->prev;
          pcVar10 = "relink: failed for MW-%p; reverse chain fragmented at MW-%p, \'prev\' is %p\n";
LAB_001093eb:
          mwWrite(pcVar10,mw,pmVar8,pmVar7);
          goto LAB_00108f27;
        }
LAB_00108e9f:
      }
      mwWrite("relink: MW-%p not found in reverse chain search\n",mw);
      mwFlush();
      if (!bVar3) goto LAB_00109401;
      mwWrite("relink: heap appears intact, MW-%p probably garbage pointer\n",mw);
      goto LAB_001092b6;
    }
    mwWrite("relink: MW-%p is the tail (last) allocation\n",mw);
    if (mw->next != (mwData *)0x0) {
      mwWrite("relink: MW-%p next pointer is non-NULL, you have a wild pointer\n",mw);
      mw->next = (mwData *)0x0;
    }
LAB_00109401:
    iVar4 = mwIsReadAddr(mw->file,1);
    if ((iVar4 != 0) && (pmVar5 = mwStatGet(mw->file,-1,0), pmVar5 == (mwStat *)0x0)) {
      mw->file = "<relinked>";
    }
    mw->check = mw->count ^ mw->size ^ (long)mw->line ^ 0xfe0180;
  }
  iVar4 = mwIsHeapOK((mwData *)0x0);
  if (iVar4 != 0) {
    if (mwHead == (mwData *)0x0) {
      lVar6 = 0;
      lVar12 = 0;
    }
    else {
      lVar12 = 0;
      lVar6 = 0;
      pmVar8 = mwHead;
      do {
        lVar6 = lVar6 + 1;
        lVar12 = lVar12 + pmVar8->size;
        pmVar8 = pmVar8->next;
      } while (pmVar8 != (mwData *)0x0);
    }
    if (mwNumCurAlloc - lVar6 == 0) {
      mwWrite("relink: successful, ");
      if (lVar12 == mwStatCurAlloc) {
        mwWrite("no allocations lost\n");
        iVar4 = 1;
      }
      else {
        iVar4 = 1;
        if (mw != (mwData *)0x0) {
          mwWrite("size information lost for MW-%p\n",mw);
          mw->size = 0;
        }
      }
    }
    else {
      iVar4 = 0;
      mwWrite("relink: partial, %ld MW-blocks of %ld bytes lost\n",
              (mwNumCurAlloc - lVar6) + mwNmlNumAlloc,(mwNmlCurAlloc - lVar12) + mwStatCurAlloc);
    }
    return iVar4;
  }
  pcVar11 = "relink: heap verification FAILS - aborting program\n";
LAB_001095b0:
  mwWrite(pcVar11);
  mwFlushingB2 = 1;
  mwFlushingB1 = 1;
  mwFlushing = 1;
  mwFlush();
  abort();
}

Assistant:

static int mwRelink(mwData *mw, const char *file, int line)
{
	int fails;
	mwData *mw1, *mw2;
	long count, size;
	mwStat *ms;

	if (file == NULL) {
		file = "unknown";
	}

	if (mw == NULL) {
		mwWrite("relink: cannot repair MW at NULL\n");
		FLUSH();
		goto emergency;
	}

	if (!mwIsSafeAddr(mw, mwDataSize)) {
		mwWrite("relink: MW-%p is a garbage pointer\n", mw);
		FLUSH();
		goto emergency;
	}

	mwWrite("relink: <%ld> %s(%d) attempting to repair MW-%p...\n", mwCounter, file, line, mw);
	FLUSH();
	fails = 0;

	/* Repair from head */
	if (mwHead != mw) {
		if (!mwIsSafeAddr(mwHead, mwDataSize)) {
			mwWrite("relink: failed for MW-%p; head pointer destroyed\n", mw);
			FLUSH();
			goto emergency;
		}
		for (mw1 = mwHead; mw1; mw1 = mw1->next) {
			if (mw1->next == mw) {
				mw->prev = mw1;
				break;
			}
			if (mw1->next &&
				(!mwIsSafeAddr(mw1->next, mwDataSize) || mw1->next->prev != mw1)) {
				mwWrite("relink: failed for MW-%p; forward chain fragmented at MW-%p: 'next' is %p\n", mw, mw1, mw1->next);
				FLUSH();
				goto emergency;
			}
		}
		if (mw1 == NULL) {
			mwWrite("relink: MW-%p not found in forward chain search\n", mw);
			FLUSH();
			fails ++;
		}
	} else {
		mwWrite("relink: MW-%p is the head (first) allocation\n", mw);
		if (mw->prev != NULL) {
			mwWrite("relink: MW-%p prev pointer is non-NULL, you have a wild pointer\n", mw);
			mw->prev = NULL;
		}
	}

	/* Repair from tail */
	if (mwTail != mw) {
		if (!mwIsSafeAddr(mwTail, mwDataSize)) {
			mwWrite("relink: failed for MW-%p; tail pointer destroyed\n", mw);
			FLUSH();
			goto emergency;
		}
		for (mw1 = mwTail; mw1; mw1 = mw1->prev) {
			if (mw1->prev == mw) {
				mw->next = mw1;
				break;
			}
			if (mw1->prev && (!mwIsSafeAddr(mw1->prev, mwDataSize) || mw1->prev->next != mw1)) {
				mwWrite("relink: failed for MW-%p; reverse chain fragmented at MW-%p, 'prev' is %p\n", mw, mw1, mw1->prev);
				FLUSH();
				goto emergency;
			}
		}
		if (mw1 == NULL) {
			mwWrite("relink: MW-%p not found in reverse chain search\n", mw);
			FLUSH();
			fails ++;
		}
	} else {
		mwWrite("relink: MW-%p is the tail (last) allocation\n", mw);
		if (mw->next != NULL) {
			mwWrite("relink: MW-%p next pointer is non-NULL, you have a wild pointer\n", mw);
			mw->next = NULL;
		}
	}

	if (fails > 1) {
		mwWrite("relink: heap appears intact, MW-%p probably garbage pointer\n", mw);
		FLUSH();
		goto verifyok;
	}

	/* restore MW info where possible */
	if (mwIsReadAddr(mw->file, 1)) {
		ms = mwStatGet(mw->file, -1, 0);
		if (ms == NULL) {
			mw->file = "<relinked>";
		}
	}
	mw->check = CHKVAL(mw);
	goto verifyok;

	/* Emergency repair */
emergency:

	if (mwHead == NULL && mwTail == NULL) {
		if (mwStatCurAlloc == 0) {
			mwWrite("relink: <%ld> %s(%d) heap is empty, nothing to repair\n", mwCounter, file, line);
		} else {
			mwWrite("relink: <%ld> %s(%d) heap damaged beyond repair\n", mwCounter, file, line);
		}
		FLUSH();
		return 0;
	}

	mwWrite("relink: <%ld> %s(%d) attempting emergency repairs...\n", mwCounter, file, line);
	FLUSH();

	if (mwHead == NULL || mwTail == NULL) {
		if (mwHead == NULL) {
			mwWrite("relink: mwHead is NULL, but mwTail is %p\n", mwTail);
		} else {
			mwWrite("relink: mwTail is NULL, but mwHead is %p\n", mwHead);
		}
	}

	mw1 = NULL;
	if (mwHead != NULL) {
		if (!mwIsReadAddr(mwHead, mwDataSize) || mwHead->check != CHKVAL(mwHead)) {
			mwWrite("relink: mwHead (MW-%p) is damaged, skipping forward scan\n", mwHead);
			mwHead = NULL;
			goto scan_reverse;
		}
		if (mwHead->prev != NULL) {
			mwWrite("relink: the mwHead pointer's 'prev' member is %p, not NULL\n", mwHead->prev);
		}
		for (mw1 = mwHead; mw1; mw1 = mw1->next) {
			if (mw1->next) {
				if (!mwIsReadAddr(mw1->next, mwDataSize) ||
					(!mw1->next->check) != CHKVAL(mw1) ||
					mw1->next->prev != mw1) {
					mwWrite("relink: forward chain's last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
							mw1, mw1->size, (mw->flag & MW_NML) ? "NoMansLand " : "", mw1->file, mw1->line);
					if (mwIsReadAddr(mw1->next, mwDataSize)) {
						mwWrite("relink: forward chain's first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
								mw1->next, mw1->size, (mw->flag & MW_NML) ? "NoMansLand " : "",
								mwIsReadAddr(mw1->file, 16) ? mw1->file : "<garbage-pointer>", mw1->line);
					} else {
						mwWrite("relink: the 'next' pointer of this MW points to %p, which is out-of-legal-access\n",
								mw1->next);
					}
					break;
				}
			}
		}
	}


scan_reverse:
	mw2 = NULL;
	if (mwTail != NULL) {
		if (!mwIsReadAddr(mwTail, mwDataSize) || mwTail->check != CHKVAL(mwTail)) {
			mwWrite("relink: mwTail (%p) is damaged, skipping reverse scan\n", mwTail);
			mwTail = NULL;
			goto analyze;
		}
		if (mwTail->next != NULL) {
			mwWrite("relink: the mwTail pointer's 'next' member is %p, not NULL\n", mwTail->next);
		}
		for (mw2 = mwTail; mw2; mw2 = mw2->prev) {
			if (mw2->prev) {
				if (!mwIsReadAddr(mw2->prev, mwDataSize) ||
					(!mw2->prev->check) != CHKVAL(mw2) ||
					mw2->prev->next != mw2) {
					mwWrite("relink: reverse chain's last intact MW is MW-%p, %ld %sbytes at %s(%d)\n",
							mw2, mw2->size, (mw->flag & MW_NML) ? "NoMansLand " : "", mw2->file, mw2->line);
					if (mwIsReadAddr(mw2->prev, mwDataSize)) {
						mwWrite("relink: reverse chain's first damaged MW is MW-%p, %ld %sbytes at %s(%d)\n",
								mw2->prev, mw2->size, (mw->flag & MW_NML) ? "NoMansLand " : "",
								mwIsReadAddr(mw2->file, 16) ? mw2->file : "<garbage-pointer>", mw2->line);
					} else {
						mwWrite("relink: the 'prev' pointer of this MW points to %p, which is out-of-legal-access\n",
								mw2->prev);
					}
					break;
				}
			}
		}
	}

analyze:
	if (mwHead == NULL && mwTail == NULL) {
		mwWrite("relink: both head and tail pointers damaged, aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}
	if (mwHead == NULL) {
		mwHead = mw2;
		mwWrite("relink: heap truncated, MW-%p designated as new mwHead\n", mw2);
		mw2->prev = NULL;
		mw1 = mw2 = NULL;
	}
	if (mwTail == NULL) {
		mwTail = mw1;
		mwWrite("relink: heap truncated, MW-%p designated as new mwTail\n", mw1);
		mw1->next = NULL;
		mw1 = mw2 = NULL;
	}
	if (mw1 == NULL && mw2 == NULL &&
		mwHead->prev == NULL && mwTail->next == NULL) {
		mwWrite("relink: verifying heap integrity...\n");
		FLUSH();
		goto verifyok;
	}
	if (mw1 && mw2 && mw1 != mw2) {
		mw1->next = mw2;
		mw2->prev = mw1;
		mwWrite("relink: emergency repairs successful, assessing damage...\n");
		FLUSH();
	} else {
		mwWrite("relink: heap totally destroyed, aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}

	/* Verify by checking that the number of active allocations */
	/* match the number of entries in the chain */
verifyok:
	if (!mwIsHeapOK(NULL)) {
		mwWrite("relink: heap verification FAILS - aborting program\n");
		mwFlushW(1);
		FLUSH();
		abort();
	}
	for (size = count = 0, mw1 = mwHead; mw1; mw1 = mw1->next) {
		count ++;
		size += (long) mw1->size;
	}
	if (count == mwNumCurAlloc) {
		mwWrite("relink: successful, ");
		if (size == mwStatCurAlloc) {
			mwWrite("no allocations lost\n");
		} else {
			if (mw != NULL) {
				mwWrite("size information lost for MW-%p\n", mw);
				mw->size = 0;
			}
		}
	} else {
		mwWrite("relink: partial, %ld MW-blocks of %ld bytes lost\n",
				mwNmlNumAlloc + mwNumCurAlloc - count, mwNmlCurAlloc + mwStatCurAlloc - size);
		return 0;
	}

	return 1;
}